

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall
wallet::CWallet::AddToWalletIfInvolvingMe
          (CWallet *this,CTransactionRef *ptx,SyncTxState *state,bool fUpdate,
          bool rescanning_old_block)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_3;
  bool bVar1;
  ushort uVar2;
  optional<bool> oVar3;
  isminetype iVar4;
  const_iterator cVar5;
  CAmount CVar6;
  const_iterator cVar7;
  _Base_ptr p_Var8;
  CWalletTx *pCVar9;
  runtime_error *this_00;
  undefined4 uVar10;
  undefined7 in_register_00000009;
  pointer pCVar11;
  CTxOut *txout;
  pointer pCVar12;
  undefined4 uVar13;
  undefined7 in_register_00000081;
  _Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> __tmp;
  _Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> _Var14;
  Txid *this_01;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  CTransactionRef tx;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar17;
  TxState tx_state;
  undefined1 rescanning_old_block_00;
  undefined4 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7c [12];
  element_type *tx_00;
  pointer pCVar18;
  pointer pCVar19;
  Txid *pTVar20;
  CScript *script;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var21;
  _Base_ptr p_Var22;
  undefined1 fFlushOnClose;
  byte bVar23;
  SyncTxState *pSVar24;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  *this_02;
  pointer in_stack_fffffffffffffec8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffed0;
  pointer in_stack_fffffffffffffed8;
  pointer in_stack_fffffffffffffee0;
  pointer in_stack_fffffffffffffee8;
  _Storage<wallet::AddressPurpose,_true> in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined1 local_108 [32];
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_e8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  uVar13 = (undefined4)CONCAT71(in_register_00000081,rescanning_old_block);
  uVar10 = (undefined4)CONCAT71(in_register_00000009,fUpdate);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tx_00 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pSVar24 = state;
  if ((state->
      super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      ).
      super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      ._M_index == '\0') {
    pCVar12 = (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar18 = (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pCVar12 != pCVar18) {
      this_02 = &(this->mapTxSpends)._M_h;
      this_01 = &tx_00->hash;
      pTVar20 = this_01;
      do {
        pVar17 = std::
                 _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 ::equal_range(this_02,&pCVar12->prevout);
        if ((__node_type *)
            pVar17.first.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
            _M_cur != pVar17.second.
                      super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur.
                      super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>) {
          do {
            _Var21._M_cur =
                 (__node_type *)
                 pVar17.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                 ._M_cur;
            _Var14 = pVar17.first.
                     super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur;
            auVar16[0] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x2c));
            auVar16[1] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[1] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x2d));
            auVar16[2] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[2] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x2e));
            auVar16[3] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[3] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x2f));
            auVar16[4] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[4] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x30));
            auVar16[5] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[5] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x31));
            auVar16[6] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[6] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x32));
            auVar16[7] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[7] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x33));
            auVar16[8] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[8] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x34));
            auVar16[9] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[9] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x35));
            auVar16[10] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[10] ==
                           *(uchar *)((long)_Var14.
                                            super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                            ._M_cur + 0x36));
            auVar16[0xb] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0xb] ==
                            *(uchar *)((long)_Var14.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x37));
            auVar16[0xc] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0xc] ==
                            *(uchar *)((long)_Var14.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x38));
            auVar16[0xd] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0xd] ==
                            *(uchar *)((long)_Var14.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x39));
            auVar16[0xe] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0xe] ==
                            *(uchar *)((long)_Var14.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x3a));
            auVar16[0xf] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0xf] ==
                            *(uchar *)((long)_Var14.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x3b));
            auVar15[0] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x10] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x3c));
            auVar15[1] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x11] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x3d));
            auVar15[2] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x12] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x3e));
            auVar15[3] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x13] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x3f));
            auVar15[4] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x14] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x40));
            auVar15[5] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x15] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x41));
            auVar15[6] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x16] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x42));
            auVar15[7] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x17] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x43));
            auVar15[8] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x18] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x44));
            auVar15[9] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x19] ==
                          *(uchar *)((long)_Var14.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x45));
            auVar15[10] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                           *(uchar *)((long)_Var14.
                                            super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                            ._M_cur + 0x46));
            auVar15[0xb] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                            *(uchar *)((long)_Var14.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x47));
            auVar15[0xc] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                            *(uchar *)((long)_Var14.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x48));
            auVar15[0xd] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                            *(uchar *)((long)_Var14.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x49));
            auVar15[0xe] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                            *(uchar *)((long)_Var14.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x4a));
            auVar15[0xf] = -((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                            *(uchar *)((long)_Var14.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x4b));
            auVar15 = auVar15 & auVar16;
            if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff) {
              base_blob<256u>::ToString_abi_cxx11_(&local_58,this_01);
              base_blob<256u>::ToString_abi_cxx11_(&local_78,state);
              base_blob<256u>::ToString_abi_cxx11_
                        (&local_98,
                         (uint256 *)
                         ((long)_Var14.
                                super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                ._M_cur + 0x2c));
              base_blob<256u>::ToString_abi_cxx11_
                        (&local_b8,
                         (long *)((long)_Var14.
                                        super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                        ._M_cur + 8));
              in_stack_fffffffffffffe78 =
                   *(undefined4 *)
                    ((long)_Var14.
                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                           _M_cur + 0x28);
              parameters._4_12_ = in_stack_fffffffffffffe7c;
              parameters._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe78;
              parameters.field_2._M_allocated_capacity = (size_type)tx_00;
              parameters.field_2._8_8_ = pCVar18;
              parameters_1._M_string_length = (size_type)pTVar20;
              parameters_1._M_dataplus._M_p = (pointer)pCVar12;
              parameters_1.field_2._M_allocated_capacity = (size_type)_Var21._M_cur;
              parameters_1.field_2._8_4_ = uVar13;
              parameters_1.field_2._12_4_ = uVar10;
              parameters_2._M_string_length = (size_type)this_02;
              parameters_2._M_dataplus._M_p = (pointer)pSVar24;
              parameters_2.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffec8;
              parameters_2.field_2._8_8_ = in_stack_fffffffffffffed0._M_pi;
              parameters_3._M_string_length = (size_type)in_stack_fffffffffffffee0;
              parameters_3._M_dataplus._M_p = (pointer)in_stack_fffffffffffffed8;
              parameters_3.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffee8;
              parameters_3.field_2._8_4_ = in_stack_fffffffffffffef0._M_value;
              parameters_3.field_2._12_4_ = in_stack_fffffffffffffef4;
              WalletLogPrintf<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_int>
                        (this,
                         "Transaction %s (in block %s) conflicts with wallet transaction %s (both spend %s:%i)\n"
                         ,parameters,parameters_1,parameters_2,parameters_3,(uint)&local_58);
              this_01 = pTVar20;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
                this_01 = pTVar20;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
              MarkConflicted(this,(uint256 *)state,
                             *(int *)((long)&(pSVar24->
                                             super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                             ).
                                             super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                             .
                                             super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                             .
                                             super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                             .
                                             super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                             .
                                             super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                             ._M_u + 0x20),
                             (uint256 *)
                             ((long)_Var14.
                                    super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                    ._M_cur + 0x2c));
              pTVar20 = this_01;
            }
            pVar17.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
            _M_cur = (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)
                     (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var21._M_cur;
            pVar17.first.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
            _M_cur = (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)
                     *(_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)
                      _Var14.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                      _M_cur;
          } while ((__node_type *)
                   *(_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)
                    _Var14.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                    _M_cur != _Var21._M_cur);
        }
        pCVar12 = pCVar12 + 1;
      } while (pCVar12 != pCVar18);
    }
  }
  bVar23 = (byte)uVar10;
  cVar5 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mapWallet)._M_h,&(tx_00->hash).m_wrapped);
  if ((cVar5.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur !=
       (__node_type *)0x0 & (bVar23 ^ 1)) == 0) {
    if (cVar5.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur ==
        (__node_type *)0x0) {
      pCVar19 = (tx_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (pCVar11 = (tx_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start; pCVar11 != pCVar19; pCVar11 = pCVar11 + 1) {
        iVar4 = IsMine(this,&pCVar11->scriptPubKey);
        if (iVar4 != ISMINE_NO) goto LAB_0015da3e;
      }
      local_e8._M_impl._0_4_ = 3;
      CVar6 = GetDebit(this,tx_00,(isminefilter *)&local_e8);
      if (CVar6 < 1) goto LAB_0015dc90;
    }
LAB_0015da3e:
    rescanning_old_block_00 = (undefined1)in_stack_fffffffffffffe78;
    fFlushOnClose = (undefined1)uVar13;
    pCVar11 = (tx_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar19 = (tx_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pCVar11 != pCVar19) {
      p_Var22 = &(this->m_address_book)._M_t._M_impl.super__Rb_tree_header._M_header;
      do {
        script = &pCVar11->scriptPubKey;
        GetScriptPubKeyMans((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                             *)&local_e8,this,script);
        p_Var8 = local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
        while ((_Rb_tree_header *)p_Var8 != &local_e8._M_impl.super__Rb_tree_header) {
          (**(code **)(**(long **)(p_Var8 + 1) + 0x50))
                    (&stack0xfffffffffffffed8,*(long **)(p_Var8 + 1),script);
          pCVar12 = in_stack_fffffffffffffed8;
          pCVar18 = in_stack_fffffffffffffee0;
          for (; in_stack_fffffffffffffed8 != in_stack_fffffffffffffee0;
              in_stack_fffffffffffffed8 =
                   (pointer)((long)&(in_stack_fffffffffffffed8->scriptWitness).stack.
                                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    ._M_impl.super__Vector_impl_data + 8)) {
            bVar1 = ((_Storage<bool,_true> *)
                    &(in_stack_fffffffffffffed8->scriptWitness).stack.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data)[1]._M_value;
            uVar2 = (ushort)bVar1;
            if (bVar1 == false) {
              oVar3 = IsInternalScriptPubKeyMan(this,*(ScriptPubKeyMan **)(p_Var8 + 1));
              *(_Optional_base<bool,_true,_true> *)
               &(in_stack_fffffffffffffed8->scriptWitness).stack.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data =
                   oVar3.super__Optional_base<bool,_true,_true>._M_payload.
                   super__Optional_payload_base<bool>;
              uVar2 = (ushort)oVar3.super__Optional_base<bool,_true,_true>._M_payload.
                              super__Optional_payload_base<bool> >> 8;
            }
            if ((((uVar2 & 1) != 0) &&
                (((_Storage<bool,_true> *)
                 &(in_stack_fffffffffffffed8->scriptWitness).stack.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data)->_M_value == false)) &&
               ((cVar7 = std::
                         _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
                         ::find(&(this->m_address_book)._M_t,(key_type *)in_stack_fffffffffffffed8),
                cVar7._M_node == p_Var22 || (*(char *)&cVar7._M_node[4]._M_left == '\0')))) {
              local_108._0_8_ = local_108 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"");
              SetAddressBook(this,(CTxDestination *)in_stack_fffffffffffffed8,(string *)local_108,
                             (optional<wallet::AddressPurpose> *)&stack0xfffffffffffffef0);
              if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
                operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
              }
            }
          }
          std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>::
          ~vector((vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> *)
                  &stack0xfffffffffffffed8);
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
          in_stack_fffffffffffffed8 = pCVar12;
          in_stack_fffffffffffffee0 = pCVar18;
        }
        std::
        _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
        ::~_Rb_tree(&local_e8);
        rescanning_old_block_00 = (undefined1)in_stack_fffffffffffffe78;
        fFlushOnClose = (undefined1)uVar13;
        pCVar11 = pCVar11 + 1;
      } while (pCVar11 != pCVar19);
    }
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1279:43)_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>_&>
      ::_S_vtable._M_arr
      [(pSVar24->
       super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       ).
       super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       ._M_index]._M_data)
              ((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                *)&local_e8,(anon_class_1_0_00000001 *)local_108,pSVar24);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CTransaction_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffed0,
               (CTransaction **)&stack0xfffffffffffffec8,(allocator<CTransaction> *)local_108,tx_00)
    ;
    local_108._16_16_ = (undefined1  [16])0x0;
    local_108._0_16_ = (undefined1  [16])0x0;
    tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_e8;
    tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xfffffffffffffec8;
    pCVar9 = AddToWallet(this,tx,(TxState *)local_108,(UpdateWalletTxFn *)0x0,(bool)fFlushOnClose,
                         (bool)rescanning_old_block_00);
    if ((code *)local_108._16_8_ != (code *)0x0) {
      (*(code *)local_108._16_8_)(local_108,local_108,3);
    }
    if (in_stack_fffffffffffffed0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffed0._M_pi)
      ;
    }
    if (pCVar9 == (CWalletTx *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"DB error adding transaction to wallet, write failed");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0015de9c;
    }
    bVar1 = true;
  }
  else {
LAB_0015dc90:
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
LAB_0015de9c:
  __stack_chk_fail();
}

Assistant:

bool CWallet::AddToWalletIfInvolvingMe(const CTransactionRef& ptx, const SyncTxState& state, bool fUpdate, bool rescanning_old_block)
{
    const CTransaction& tx = *ptx;
    {
        AssertLockHeld(cs_wallet);

        if (auto* conf = std::get_if<TxStateConfirmed>(&state)) {
            for (const CTxIn& txin : tx.vin) {
                std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range = mapTxSpends.equal_range(txin.prevout);
                while (range.first != range.second) {
                    if (range.first->second != tx.GetHash()) {
                        WalletLogPrintf("Transaction %s (in block %s) conflicts with wallet transaction %s (both spend %s:%i)\n", tx.GetHash().ToString(), conf->confirmed_block_hash.ToString(), range.first->second.ToString(), range.first->first.hash.ToString(), range.first->first.n);
                        MarkConflicted(conf->confirmed_block_hash, conf->confirmed_block_height, range.first->second);
                    }
                    range.first++;
                }
            }
        }

        bool fExisted = mapWallet.count(tx.GetHash()) != 0;
        if (fExisted && !fUpdate) return false;
        if (fExisted || IsMine(tx) || IsFromMe(tx))
        {
            /* Check if any keys in the wallet keypool that were supposed to be unused
             * have appeared in a new transaction. If so, remove those keys from the keypool.
             * This can happen when restoring an old wallet backup that does not contain
             * the mostly recently created transactions from newer versions of the wallet.
             */

            // loop though all outputs
            for (const CTxOut& txout: tx.vout) {
                for (const auto& spk_man : GetScriptPubKeyMans(txout.scriptPubKey)) {
                    for (auto &dest : spk_man->MarkUnusedAddresses(txout.scriptPubKey)) {
                        // If internal flag is not defined try to infer it from the ScriptPubKeyMan
                        if (!dest.internal.has_value()) {
                            dest.internal = IsInternalScriptPubKeyMan(spk_man);
                        }

                        // skip if can't determine whether it's a receiving address or not
                        if (!dest.internal.has_value()) continue;

                        // If this is a receiving address and it's not in the address book yet
                        // (e.g. it wasn't generated on this node or we're restoring from backup)
                        // add it to the address book for proper transaction accounting
                        if (!*dest.internal && !FindAddressBookEntry(dest.dest, /* allow_change= */ false)) {
                            SetAddressBook(dest.dest, "", AddressPurpose::RECEIVE);
                        }
                    }
                }
            }

            // Block disconnection override an abandoned tx as unconfirmed
            // which means user may have to call abandontransaction again
            TxState tx_state = std::visit([](auto&& s) -> TxState { return s; }, state);
            CWalletTx* wtx = AddToWallet(MakeTransactionRef(tx), tx_state, /*update_wtx=*/nullptr, /*fFlushOnClose=*/false, rescanning_old_block);
            if (!wtx) {
                // Can only be nullptr if there was a db write error (missing db, read-only db or a db engine internal writing error).
                // As we only store arriving transaction in this process, and we don't want an inconsistent state, let's throw an error.
                throw std::runtime_error("DB error adding transaction to wallet, write failed");
            }
            return true;
        }
    }
    return false;
}